

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  int index;
  Vector<unsigned_int> *this_00;
  bool bVar1;
  uint *puVar2;
  int index_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  bVar1 = IsClamped(this);
  if (!bVar1) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd4,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  bVar1 = IsClamped(other);
  if (bVar1) {
    bVar1 = LessEqual(other,this);
    if (bVar1) {
      Align(this,other);
      iVar3 = other->exponent_ - this->exponent_;
      this_00 = &this->bigits_;
      uVar5 = 0;
      for (index_00 = 0; index_00 < other->used_digits_; index_00 = index_00 + 1) {
        index = iVar3 + index_00;
        puVar2 = Vector<unsigned_int>::operator[](this_00,index);
        uVar4 = *puVar2;
        puVar2 = Vector<unsigned_int>::operator[](&other->bigits_,index_00);
        uVar4 = uVar4 - (uVar5 + *puVar2);
        puVar2 = Vector<unsigned_int>::operator[](this_00,index);
        *puVar2 = uVar4 & 0xfffffff;
        uVar5 = uVar4 >> 0x1f;
      }
      iVar3 = iVar3 + index_00;
      for (; uVar5 != 0; uVar5 = uVar5 - 1 >> 0x1f) {
        puVar2 = Vector<unsigned_int>::operator[](this_00,iVar3);
        uVar5 = *puVar2;
        puVar2 = Vector<unsigned_int>::operator[](this_00,iVar3);
        *puVar2 = uVar5 - 1 & 0xfffffff;
        iVar3 = iVar3 + 1;
      }
      Clamp(this);
      return;
    }
    __assert_fail("LessEqual(other, *this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd7,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  __assert_fail("other.IsClamped()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0xd5,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}